

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O2

unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
 __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator> *this)

{
  cmExtraCodeLiteGenerator *this_00;
  cmExternalMakefileProjectGeneratorFactory *in_RSI;
  string sStack_38;
  
  this_00 = (cmExtraCodeLiteGenerator *)operator_new(0x90);
  cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator(this_00);
  (this->super_cmExternalMakefileProjectGeneratorFactory).
  _vptr_cmExternalMakefileProjectGeneratorFactory = (_func_int **)this_00;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&sStack_38,in_RSI);
  std::__cxx11::string::_M_assign
            ((string *)&(this_00->super_cmExternalMakefileProjectGenerator).Name);
  std::__cxx11::string::~string((string *)&sStack_38);
  return (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
          )(__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmExternalMakefileProjectGenerator>
  CreateExternalMakefileProjectGenerator() const override
  {
    std::unique_ptr<cmExternalMakefileProjectGenerator> p(new T);
    p->SetName(this->GetName());
    return p;
  }